

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastunpack43(uint32_t *in,uint64_t *out)

{
  uint32_t *local_8;
  
  local_8 = in;
  Unroller<(unsigned_short)43,_(unsigned_short)0>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack43(const uint32_t *__restrict in, uint64_t *__restrict out) {
	Unroller<43>::Unpack(in, out);
}